

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

visuals_color_cycle *
visuals_cycler_cycle_by_name(visuals_cycler *cycler,char *group_name,char *cycle_name)

{
  int iVar1;
  size_t sVar2;
  ulong local_40;
  size_t i;
  visuals_color_cycle *cycle;
  visuals_cycle_group *group;
  char *cycle_name_local;
  char *group_name_local;
  visuals_cycler *cycler_local;
  
  cycle = (visuals_color_cycle *)0x0;
  if ((group_name == (char *)0x0) || (sVar2 = strlen(group_name), sVar2 == 0)) {
    return (visuals_color_cycle *)0x0;
  }
  if ((cycle_name == (char *)0x0) || (sVar2 = strlen(cycle_name), sVar2 == 0)) {
    return (visuals_color_cycle *)0x0;
  }
  local_40 = 0;
  do {
    if (cycler->max_groups <= local_40) {
LAB_0025c96e:
      if (cycle == (visuals_color_cycle *)0x0) {
        return (visuals_color_cycle *)0x0;
      }
      local_40 = 0;
      while( true ) {
        if (cycle->max_steps <= local_40) {
          return (visuals_color_cycle *)0x0;
        }
        iVar1 = strcmp(*(char **)(*(long *)(cycle->steps + local_40 * 8) + 0x10),cycle_name);
        if (iVar1 == 0) break;
        local_40 = local_40 + 1;
      }
      return *(visuals_color_cycle **)(cycle->steps + local_40 * 8);
    }
    iVar1 = strcmp(cycler->groups[local_40]->group_name,group_name);
    if (iVar1 == 0) {
      cycle = (visuals_color_cycle *)cycler->groups[local_40];
      goto LAB_0025c96e;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static struct visuals_color_cycle *visuals_cycler_cycle_by_name(struct visuals_cycler const *cycler,
																const char *group_name,
																const char *cycle_name)
{
	struct visuals_cycle_group *group = NULL;
	struct visuals_color_cycle *cycle = NULL;
	size_t i = 0;

	if (group_name == NULL || strlen(group_name) == 0) {
		return NULL;
	}

	if (cycle_name == NULL || strlen(cycle_name) == 0) {
		return NULL;
	}

	for (i = 0; i < cycler->max_groups; i++) {
		if (streq(cycler->groups[i]->group_name, group_name)) {
			group = cycler->groups[i];
			break;
		}
	}

	if (group == NULL) {
		return NULL;
	}

	for (i = 0; i < group->max_cycles; i++) {
		if (streq(group->cycles[i]->cycle_name, cycle_name)) {
			cycle = group->cycles[i];
			break;
		}
	}

	return cycle;
}